

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O3

void test(uint original_count,uint recovery_count,uint seed)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint i;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  undefined8 uVar12;
  uint skewIndex;
  ulong uVar13;
  ffe_t fVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ushort uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  ffe_t codeword [65536];
  bool erasure [65536];
  ffe_t data [65536];
  fwht_t log_walsh2 [65536];
  ffe_t afStack_70038 [65536];
  char acStack_50038 [65536];
  ffe_t afStack_40038 [65536];
  fwht_t afStack_20038 [16];
  undefined1 auStack_20018 [131048];
  
  uVar12 = 2;
  uVar17 = 2L << ((byte)LZCOUNT(recovery_count - 1) ^ 0x1f);
  uVar15 = (uint)uVar17;
  skewIndex = uVar15 + original_count;
  iVar6 = LZCOUNT((uVar15 - 1) + original_count);
  srand(seed);
  memset(afStack_40038,0,0x20000);
  if (uVar15 < skewIndex) {
    uVar13 = (ulong)(uVar15 & 0xfffffffe);
    do {
      iVar7 = rand();
      afStack_40038[uVar13] = (ffe_t)iVar7;
      uVar13 = uVar13 + 1;
    } while (skewIndex != (uint)uVar13);
  }
  memset(afStack_70038,0,0x20000);
  uVar13 = (ulong)(uVar15 & 0xfffffffe);
  memcpy(afStack_40038,afStack_40038 + uVar13,uVar13 * 2);
  IFLT(afStack_40038,uVar15,uVar15);
  uVar10 = (uint)uVar12;
  if (uVar15 < original_count) {
    uVar17 = uVar17 & 0xffffffff;
    auVar21 = vpbroadcastq_avx512f();
    auVar21 = vmovdqu64_avx512f(auVar21);
    do {
      memcpy(afStack_70038,afStack_40038 + uVar13 + uVar17,uVar13 * 2);
      uVar16 = (int)uVar17 + uVar15;
      uVar17 = (ulong)uVar16;
      IFLT(afStack_70038,uVar15,uVar16);
      uVar10 = (uint)uVar12;
      auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar26 = vmovdqu64_avx512f(auVar21);
      if (uVar15 != 0) {
        uVar8 = 0;
        do {
          auVar27 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar27,auVar25);
          auVar29 = vporq_avx512f(auVar27,auVar23);
          auVar30 = vporq_avx512f(auVar27,auVar24);
          auVar27 = vporq_avx512f(auVar27,auVar22);
          uVar1 = vpcmpuq_avx512f(auVar27,auVar26,2);
          bVar2 = (byte)uVar1;
          uVar1 = vpcmpuq_avx512f(auVar29,auVar26,2);
          bVar3 = (byte)uVar1;
          uVar1 = vpcmpuq_avx512f(auVar28,auVar26,2);
          bVar5 = (byte)uVar1;
          uVar1 = vpcmpuq_avx512f(auVar30,auVar26,2);
          bVar4 = (byte)uVar1;
          uVar18 = CONCAT11(bVar5,bVar4);
          uVar11 = CONCAT22(uVar18,CONCAT11(bVar3,bVar2));
          auVar27 = vmovdqu16_avx512bw(*(undefined1 (*) [64])(afStack_70038 + uVar8));
          auVar28._2_2_ = (ushort)((byte)(uVar11 >> 1) & 1) * auVar27._2_2_;
          auVar28._0_2_ = (ushort)(bVar2 & 1) * auVar27._0_2_;
          auVar28._4_2_ = (ushort)((byte)(uVar11 >> 2) & 1) * auVar27._4_2_;
          auVar28._6_2_ = (ushort)((byte)(uVar11 >> 3) & 1) * auVar27._6_2_;
          auVar28._8_2_ = (ushort)((byte)(uVar11 >> 4) & 1) * auVar27._8_2_;
          auVar28._10_2_ = (ushort)((byte)(uVar11 >> 5) & 1) * auVar27._10_2_;
          auVar28._12_2_ = (ushort)((byte)(uVar11 >> 6) & 1) * auVar27._12_2_;
          auVar28._14_2_ = (ushort)((byte)(uVar11 >> 7) & 1) * auVar27._14_2_;
          auVar28._16_2_ = (ushort)(bVar3 & 1) * auVar27._16_2_;
          auVar28._18_2_ = (ushort)((byte)(uVar11 >> 9) & 1) * auVar27._18_2_;
          auVar28._20_2_ = (ushort)((byte)(uVar11 >> 10) & 1) * auVar27._20_2_;
          auVar28._22_2_ = (ushort)((byte)(uVar11 >> 0xb) & 1) * auVar27._22_2_;
          auVar28._24_2_ = (ushort)((byte)(uVar11 >> 0xc) & 1) * auVar27._24_2_;
          auVar28._26_2_ = (ushort)((byte)(uVar11 >> 0xd) & 1) * auVar27._26_2_;
          auVar28._28_2_ = (ushort)((byte)(uVar11 >> 0xe) & 1) * auVar27._28_2_;
          auVar28._30_2_ = (ushort)((byte)(uVar11 >> 0xf) & 1) * auVar27._30_2_;
          auVar28._32_2_ = (ushort)(bVar4 & 1) * auVar27._32_2_;
          auVar28._34_2_ = (ushort)((byte)(uVar18 >> 1) & 1) * auVar27._34_2_;
          auVar28._36_2_ = (ushort)((byte)(uVar18 >> 2) & 1) * auVar27._36_2_;
          auVar28._38_2_ = (ushort)((byte)(uVar18 >> 3) & 1) * auVar27._38_2_;
          auVar28._40_2_ = (ushort)((byte)(uVar18 >> 4) & 1) * auVar27._40_2_;
          auVar28._42_2_ = (ushort)((byte)(uVar18 >> 5) & 1) * auVar27._42_2_;
          auVar28._44_2_ = (ushort)((byte)(uVar18 >> 6) & 1) * auVar27._44_2_;
          auVar28._46_2_ = (ushort)((byte)(uVar18 >> 7) & 1) * auVar27._46_2_;
          auVar28._48_2_ = (ushort)(bVar5 & 1) * auVar27._48_2_;
          auVar28._50_2_ = (ushort)(bVar5 >> 1 & 1) * auVar27._50_2_;
          auVar28._52_2_ = (ushort)(bVar5 >> 2 & 1) * auVar27._52_2_;
          auVar28._54_2_ = (ushort)(bVar5 >> 3 & 1) * auVar27._54_2_;
          auVar28._56_2_ = (ushort)(bVar5 >> 4 & 1) * auVar27._56_2_;
          auVar28._58_2_ = (ushort)(bVar5 >> 5 & 1) * auVar27._58_2_;
          auVar28._60_2_ = (ushort)(bVar5 >> 6 & 1) * auVar27._60_2_;
          auVar28._62_2_ = (ushort)(bVar5 >> 7) * auVar27._62_2_;
          auVar27 = vmovdqu16_avx512bw(*(undefined1 (*) [64])(afStack_40038 + uVar8));
          auVar29._2_2_ = (ushort)((byte)(uVar11 >> 1) & 1) * auVar27._2_2_;
          auVar29._0_2_ = (ushort)(bVar2 & 1) * auVar27._0_2_;
          auVar29._4_2_ = (ushort)((byte)(uVar11 >> 2) & 1) * auVar27._4_2_;
          auVar29._6_2_ = (ushort)((byte)(uVar11 >> 3) & 1) * auVar27._6_2_;
          auVar29._8_2_ = (ushort)((byte)(uVar11 >> 4) & 1) * auVar27._8_2_;
          auVar29._10_2_ = (ushort)((byte)(uVar11 >> 5) & 1) * auVar27._10_2_;
          auVar29._12_2_ = (ushort)((byte)(uVar11 >> 6) & 1) * auVar27._12_2_;
          auVar29._14_2_ = (ushort)((byte)(uVar11 >> 7) & 1) * auVar27._14_2_;
          auVar29._16_2_ = (ushort)(bVar3 & 1) * auVar27._16_2_;
          auVar29._18_2_ = (ushort)((byte)(uVar11 >> 9) & 1) * auVar27._18_2_;
          auVar29._20_2_ = (ushort)((byte)(uVar11 >> 10) & 1) * auVar27._20_2_;
          auVar29._22_2_ = (ushort)((byte)(uVar11 >> 0xb) & 1) * auVar27._22_2_;
          auVar29._24_2_ = (ushort)((byte)(uVar11 >> 0xc) & 1) * auVar27._24_2_;
          auVar29._26_2_ = (ushort)((byte)(uVar11 >> 0xd) & 1) * auVar27._26_2_;
          auVar29._28_2_ = (ushort)((byte)(uVar11 >> 0xe) & 1) * auVar27._28_2_;
          auVar29._30_2_ = (ushort)((byte)(uVar11 >> 0xf) & 1) * auVar27._30_2_;
          auVar29._32_2_ = (ushort)(bVar4 & 1) * auVar27._32_2_;
          auVar29._34_2_ = (ushort)((byte)(uVar18 >> 1) & 1) * auVar27._34_2_;
          auVar29._36_2_ = (ushort)((byte)(uVar18 >> 2) & 1) * auVar27._36_2_;
          auVar29._38_2_ = (ushort)((byte)(uVar18 >> 3) & 1) * auVar27._38_2_;
          auVar29._40_2_ = (ushort)((byte)(uVar18 >> 4) & 1) * auVar27._40_2_;
          auVar29._42_2_ = (ushort)((byte)(uVar18 >> 5) & 1) * auVar27._42_2_;
          auVar29._44_2_ = (ushort)((byte)(uVar18 >> 6) & 1) * auVar27._44_2_;
          auVar29._46_2_ = (ushort)((byte)(uVar18 >> 7) & 1) * auVar27._46_2_;
          auVar29._48_2_ = (ushort)(bVar5 & 1) * auVar27._48_2_;
          auVar29._50_2_ = (ushort)(bVar5 >> 1 & 1) * auVar27._50_2_;
          auVar29._52_2_ = (ushort)(bVar5 >> 2 & 1) * auVar27._52_2_;
          auVar29._54_2_ = (ushort)(bVar5 >> 3 & 1) * auVar27._54_2_;
          auVar29._56_2_ = (ushort)(bVar5 >> 4 & 1) * auVar27._56_2_;
          auVar29._58_2_ = (ushort)(bVar5 >> 5 & 1) * auVar27._58_2_;
          auVar29._60_2_ = (ushort)(bVar5 >> 6 & 1) * auVar27._60_2_;
          auVar29._62_2_ = (ushort)(bVar5 >> 7) * auVar27._62_2_;
          auVar27 = vpxorq_avx512f(auVar29,auVar28);
          auVar27 = vmovdqu16_avx512bw(auVar27);
          *(undefined1 (*) [64])(afStack_40038 + uVar8) = auVar27;
          uVar8 = uVar8 + 0x20;
        } while ((uVar13 + 0x1f & 0xffffffffffffffe0) != uVar8);
      }
    } while (uVar16 < original_count);
  }
  FLT(afStack_40038,uVar15,uVar15,uVar10);
  memcpy(afStack_70038,afStack_40038,0x20000);
  uVar10 = 0;
  memset(acStack_50038,0,0x10000);
  if (uVar15 < recovery_count + uVar15) {
    uVar10 = 1;
    memset(acStack_50038 + (uVar15 & 0xfffffffe),1,(ulong)(recovery_count - 1) + 1);
  }
  uVar16 = 2 << ((byte)~(byte)iVar6 & 0x1f);
  lVar9 = 0;
  do {
    auVar21 = vpmovzxbw_avx512bw(*(undefined1 (*) [32])(acStack_50038 + lVar9));
    auVar21 = vmovdqu64_avx512f(auVar21);
    *(undefined1 (*) [64])(afStack_20038 + lVar9) = auVar21;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x10000);
  FWHT(afStack_20038,uVar10);
  auVar21 = vpbroadcastd_avx512f(ZEXT416(0x80008001));
  auVar22 = vpmovsxbd_avx512f(_DAT_001032a4);
  uVar11 = 0x165090;
  lVar9 = 0;
  do {
    auVar23 = vpmovzxwd_avx512f(*(undefined1 (*) [32])(auStack_20018 + lVar9));
    auVar24 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)log_walsh + lVar9 + 0x20));
    auVar25 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)afStack_20038 + lVar9));
    auVar26 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)log_walsh + lVar9));
    auVar23 = vpmulld_avx512f(auVar24,auVar23);
    auVar24 = vpmulld_avx512f(auVar26,auVar25);
    auVar25 = vpshufd_avx512f(auVar23,0xf5);
    auVar26 = vpmuludq_avx512f(auVar23,auVar21);
    auVar27 = vpmuludq_avx512f(auVar24,auVar21);
    auVar25 = vpmuludq_avx512f(auVar25,auVar21);
    auVar25 = vpermt2d_avx512f(auVar26,auVar22,auVar25);
    auVar26 = vpshufd_avx512f(auVar24,0xf5);
    auVar26 = vpmuludq_avx512f(auVar26,auVar21);
    auVar26 = vpermt2d_avx512f(auVar27,auVar22,auVar26);
    auVar25 = vpsrld_avx512f(auVar25,0xf);
    auVar23 = vpaddd_avx512f(auVar23,auVar25);
    auVar19 = vpmovdw_avx512f(auVar23);
    auVar23 = vpsrld_avx512f(auVar26,0xf);
    auVar23 = vpaddd_avx512f(auVar24,auVar23);
    auVar20 = vpmovdw_avx512f(auVar23);
    auVar23 = vinserti64x4_avx512f(ZEXT3264(auVar20),auVar19,1);
    auVar23 = vmovdqu64_avx512f(auVar23);
    *(undefined1 (*) [64])((long)afStack_20038 + lVar9) = auVar23;
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0x20000);
  FWHT(afStack_20038,uVar10);
  if (skewIndex != 0) {
    uVar11 = 0x125090;
    uVar17 = 0;
    do {
      if ((acStack_50038[uVar17] == '\0') && ((ulong)afStack_70038[uVar17] != 0)) {
        fVar14 = GFExp[((uint)GFLog[afStack_70038[uVar17]] + (uint)afStack_20038[uVar17] >> 0x10) +
                       (uint)GFLog[afStack_70038[uVar17]] + (uint)afStack_20038[uVar17] & 0xffff];
      }
      else {
        fVar14 = 0;
      }
      afStack_70038[uVar17] = fVar14;
      uVar17 = uVar17 + 1;
    } while (skewIndex != uVar17);
  }
  if (skewIndex < uVar16) {
    memset(afStack_70038 + skewIndex,0,(ulong)((~original_count - uVar15) + uVar16) * 2 + 2);
  }
  IFLT(afStack_70038,uVar16,0);
  if (iVar6 != 0) {
    uVar15 = 1;
    do {
      uVar11 = (uVar15 - 1 ^ uVar15) + 1 >> 1;
      if (uVar15 - uVar11 < uVar15) {
        lVar9 = 0;
        do {
          afStack_70038[(ulong)(uVar15 - uVar11) + lVar9] =
               afStack_70038[(ulong)(uVar15 - uVar11) + lVar9] ^ afStack_70038[uVar15 + (int)lVar9];
          lVar9 = lVar9 + 1;
        } while (uVar11 != (uint)lVar9);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar16);
  }
  FLT(afStack_70038,uVar16,skewIndex,uVar11);
  lVar9 = 0;
  do {
    if (acStack_50038[lVar9] == '\x01') {
      if ((ulong)afStack_70038[lVar9] == 0) {
        fVar14 = 0;
      }
      else {
        uVar15 = (afStack_20038[lVar9] ^ 0xffff) + (uint)GFLog[afStack_70038[lVar9]];
        fVar14 = GFExp[(uVar15 >> 0x10) + uVar15 & 0xffff];
      }
      afStack_70038[lVar9] = fVar14;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x10000);
  lVar9 = 0;
  while ((acStack_50038[lVar9] != '\x01' || (afStack_40038[lVar9] == afStack_70038[lVar9]))) {
    lVar9 = lVar9 + 1;
    if (lVar9 == 0x10000) {
      printf(":D ");
      return;
    }
  }
  printf("Decoding Error with seed = %d!\n",(ulong)seed);
  return;
}

Assistant:

void test(unsigned original_count, unsigned recovery_count, unsigned seed)
{
    unsigned m = 2UL << LastNonzeroBit64(recovery_count - 1);
    unsigned n = 2UL << LastNonzeroBit64(m + original_count - 1);

    srand(seed);

    //-----------Generating message----------

    // Message array
    ffe_t data[kFieldSize] = {0};

    // Filled with random numbers
    for (unsigned i = m; i < m + original_count; ++i)
        data[i] = (ffe_t)rand();


    //---------encoding----------

    ffe_t codeword[kFieldSize] = {};
    // First m codewords are for the parity data
    encodeH(data + m, m, original_count, data, codeword);
    //encodeL(data, k, codeword); // does not seem to work with any input?  what else needs to change?

    memcpy(codeword, data, sizeof(ffe_t) * kFieldSize);


    //--------erasure simulation---------

    // Array indicating erasures
    bool erasure[kFieldSize] = {
        false
    };

    // Tag the first "recovery_count" elements as erasures
    for (unsigned i = m; i < m + recovery_count; ++i)
        erasure[i] = true;

#if 0
    // permuting the erasure array
    for (unsigned i = m + original_count - 1; i > 0; --i)
    {
        unsigned pos = rand() % (i + 1);

        if (i != pos)
        {
            bool tmp = erasure[i];
            erasure[i] = erasure[pos];
            erasure[pos] = tmp;
        }
    }
#endif


    //---------main processing----------
    decode(codeword, m, original_count, n, erasure);

    // Check the correctness of the result
    for (unsigned i = 0; i < kFieldSize; ++i)
    {
        if (erasure[i])
        {
            if (data[i] != codeword[i])
            {
                printf("Decoding Error with seed = %d!\n", seed);
                LEO_DEBUG_BREAK;
                return;
            }
        }
    }

    printf(":D ");
}